

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureGather2DArrayCase::createInstance
          (TextureGather2DArrayCase *this,Context *context)

{
  GatherType gatherType;
  OffsetSize OVar1;
  Gather2DArrayArgs *__cur;
  VkPhysicalDeviceProperties *pVVar2;
  TextureGatherInstance *this_00;
  Context *pCVar3;
  undefined1 *puVar4;
  IVec2 *pIVar5;
  pointer pGVar6;
  TextureFormat *format;
  IVec2 *pIVar7;
  undefined1 *puVar8;
  long lVar9;
  int i;
  long lVar10;
  vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
  iterations;
  TextureFormat local_50;
  vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
  local_48;
  
  gatherType = (this->m_baseParams).gatherType;
  OVar1 = (this->m_baseParams).offsetSize;
  pVVar2 = Context::getDeviceProperties(context);
  if (OVar1 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    local_50.order = (pVVar2->limits).minTexelGatherOffset;
    local_50.type = (pVVar2->limits).maxTexelGatherOffset;
  }
  else if (OVar1 == OFFSETSIZE_MINIMUM_REQUIRED) {
    local_50.order = ~RGB;
    local_50.type = UNORM_BYTE_44;
  }
  else if (OVar1 == OFFSETSIZE_NONE) {
    local_50.order = R;
    local_50.type = SNORM_INT8;
  }
  else {
    local_50.order = ~R;
    local_50.type = ~SNORM_INT8;
  }
  generate2DArrayCaseIterations
            (&local_48,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)&local_50,
             &this->m_textureSize);
  this_00 = (TextureGatherInstance *)operator_new(0x2e0);
  TextureGatherInstance::TextureGatherInstance(this_00,context,&this->m_baseParams);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TextureGather2DArrayInstance_00d5c700;
  *(undefined8 *)&this_00->field_0x264 = *(undefined8 *)(this->m_textureSize).m_data;
  *(int *)((long)&this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance +
          4) = (this->m_textureSize).m_data[2];
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
  this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
  this_00[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
  this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = (SparseContext *)0x0;
  pCVar3 = (Context *)
           std::
           _Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
           ::_M_allocate((_Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                          *)(((long)local_48.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333),(size_t)context);
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = pCVar3;
  *(Context **)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = pCVar3;
  this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = (SparseContext *)
                (((long)local_48.
                        super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_48.
                       super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                       ._M_impl.super__Vector_impl_data._M_start) + (long)pCVar3);
  if (local_48.
      super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar4 = (undefined1 *)((long)&pCVar3->m_testCtx + 4);
    pIVar5 = ((local_48.
               super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
               ._M_impl.super__Vector_impl_data._M_start)->gatherArgs).offsets;
    pGVar6 = local_48.
             super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      *(int *)&pCVar3->m_testCtx = (pGVar6->gatherArgs).componentNdx;
      lVar9 = 0;
      pIVar7 = pIVar5;
      puVar8 = puVar4;
      do {
        lVar10 = 0;
        do {
          *(int *)(puVar8 + lVar10 * 4) = pIVar7->m_data[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 == 1);
        lVar9 = lVar9 + 1;
        puVar8 = puVar8 + 8;
        pIVar7 = pIVar7 + 1;
      } while (lVar9 != 4);
      *(int *)&(pCVar3->m_device).
               super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data.
               field_0xc = pGVar6->layerNdx;
      pGVar6 = pGVar6 + 1;
      pCVar3 = (Context *)&pCVar3->m_allocator;
      puVar4 = puVar4 + 0x28;
      pIVar5 = pIVar5 + 5;
    } while (pGVar6 != local_48.
                       super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  *(Context **)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = pCVar3;
  format = &local_50;
  local_50.order = CHANNELORDER_LAST;
  local_50.type = CHANNELTYPE_LAST;
  tcu::Texture2DArray::Texture2DArray
            ((Texture2DArray *)
             &this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
              super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
              .m_data.field_0x8,format,1,1,1);
  TextureGatherInstance::init(this_00,(EVP_PKEY_CTX *)format);
  if (local_48.
      super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureGather2DArrayCase::createInstance (Context& context) const
{
	const vector<Gather2DArrayArgs>		iterations	= generate2DArrayCaseIterations(m_baseParams.gatherType,
																					m_baseParams.textureFormat,
																					getOffsetRange(m_baseParams.offsetSize, context.getDeviceProperties().limits),
																					m_textureSize);

	return new TextureGather2DArrayInstance(context, m_baseParams, m_textureSize, iterations);
}